

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

int64_t cab_minimum_consume_cfdata(archive_read *a,int64_t consumed_bytes)

{
  void *pvVar1;
  long lVar2;
  wchar_t wVar3;
  int64_t iStack_40;
  wchar_t err;
  int64_t rbytes;
  int64_t cbytes;
  cfdata *cfdata;
  cab *cab;
  int64_t consumed_bytes_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  lVar2 = *(long *)((long)pvVar1 + 0x38);
  if (*(short *)(*(long *)((long)pvVar1 + 0x28) + 6) == 0) {
    rbytes = consumed_bytes;
    if (*(long *)(lVar2 + 0x10) <= consumed_bytes) {
      rbytes = *(int64_t *)(lVar2 + 0x10);
    }
    iStack_40 = consumed_bytes - rbytes;
    *(short *)(lVar2 + 0xe) = *(short *)(lVar2 + 0xe) + (short)rbytes;
    *(short *)(lVar2 + 10) = *(short *)(lVar2 + 10) - (short)rbytes;
    *(long *)(lVar2 + 0x10) = *(long *)(lVar2 + 0x10) - rbytes;
  }
  else {
    rbytes = (int64_t)(int)((uint)*(ushort *)(lVar2 + 0xc) - (uint)*(ushort *)(lVar2 + 0xe));
    iStack_40 = consumed_bytes;
    if (0 < rbytes) {
      if (consumed_bytes < rbytes) {
        rbytes = consumed_bytes;
      }
      iStack_40 = consumed_bytes - rbytes;
      *(short *)(lVar2 + 0xe) = *(short *)(lVar2 + 0xe) + (short)rbytes;
      *(short *)(lVar2 + 10) = *(short *)(lVar2 + 10) - (short)rbytes;
    }
    if (*(long *)(lVar2 + 0x10) == 0) {
      rbytes = 0;
    }
    else {
      rbytes = *(int64_t *)(lVar2 + 0x10);
      *(undefined8 *)(lVar2 + 0x10) = 0;
    }
  }
  if (rbytes != 0) {
    cab_checksum_update(a,rbytes);
    __archive_read_consume(a,rbytes);
    *(int64_t *)((long)pvVar1 + 0x40) = rbytes + *(long *)((long)pvVar1 + 0x40);
    *(short *)(lVar2 + 6) = *(short *)(lVar2 + 6) - (short)rbytes;
    if ((*(short *)(lVar2 + 6) == 0) && (wVar3 = cab_checksum_finish(a), wVar3 < L'\0')) {
      return (long)wVar3;
    }
  }
  return iStack_40;
}

Assistant:

static int64_t
cab_minimum_consume_cfdata(struct archive_read *a, int64_t consumed_bytes)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata;
	int64_t cbytes, rbytes;
	int err;

	cfdata = cab->entry_cfdata;
	rbytes = consumed_bytes;
	if (cab->entry_cffolder->comptype == COMPTYPE_NONE) {
		if (consumed_bytes < cfdata->unconsumed)
			cbytes = consumed_bytes;
		else
			cbytes = cfdata->unconsumed;
		rbytes -= cbytes; 
		cfdata->read_offset += (uint16_t)cbytes;
		cfdata->uncompressed_bytes_remaining -= (uint16_t)cbytes;
		cfdata->unconsumed -= cbytes;
	} else {
		cbytes = cfdata->uncompressed_avail - cfdata->read_offset;
		if (cbytes > 0) {
			if (consumed_bytes < cbytes)
				cbytes = consumed_bytes;
			rbytes -= cbytes;
			cfdata->read_offset += (uint16_t)cbytes;
			cfdata->uncompressed_bytes_remaining -= (uint16_t)cbytes;
		}

		if (cfdata->unconsumed) {
			cbytes = cfdata->unconsumed;
			cfdata->unconsumed = 0;
		} else
			cbytes = 0;
	}
	if (cbytes) {
		/* Compute the sum. */
		cab_checksum_update(a, (size_t)cbytes);

		/* Consume as much as the compressor actually used. */
		__archive_read_consume(a, cbytes);
		cab->cab_offset += cbytes;
		cfdata->compressed_bytes_remaining -= (uint16_t)cbytes;
		if (cfdata->compressed_bytes_remaining == 0) {
			err = cab_checksum_finish(a);
			if (err < 0)
				return (err);
		}
	}
	return (rbytes);
}